

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O3

void __thiscall mocker::CodegenPreparation::naiveStrengthReduction(CodegenPreparation *this)

{
  int iVar1;
  FunctionModule *pFVar2;
  _List_node_base *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _List_node_base *p_Var6;
  ArithBinaryInst *pAVar7;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _List_node_base *p_Var10;
  shared_ptr<mocker::ir::IntLiteral> lit;
  undefined1 local_a9;
  ArithBinaryInst *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  IntLiteral local_98;
  shared_ptr<mocker::ir::Addr> local_80;
  OpType local_6c;
  IntLiteral local_68;
  shared_ptr<mocker::ir::IntLiteral> local_50;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  pFVar2 = (this->super_FuncPass).func;
  local_38 = (pFVar2->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  local_40 = (_List_node_base *)&pFVar2->bbs;
  if (local_38 != local_40) {
    do {
      p_Var6 = local_38 + 1;
      for (p_Var10 = local_38[1]._M_prev; p_Var10 != (_List_node_base *)&p_Var6->_M_prev;
          p_Var10 = p_Var10->_M_next) {
        p_Var3 = p_Var10[1]._M_next;
        if (*(int *)&p_Var3->_M_prev == 5) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          local_98.super_Addr._vptr_Addr = (_func_int **)p_Var3[3]._M_next;
          local_98.val = *(int64_t *)((long)(p_Var3 + 3) + 8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val)->_M_use_count + 1;
            }
          }
          local_68.super_Addr._vptr_Addr = (_func_int **)p_Var3[4]._M_next;
          local_68.val = *(int64_t *)((long)(p_Var3 + 4) + 8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val)->_M_use_count + 1;
            }
          }
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                    (&local_80,&local_98);
          if (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            iVar1 = *(int *)((long)(p_Var3 + 2) + 8);
            if (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (iVar1 != 8) {
              pp_Var4 = local_98.super_Addr._vptr_Addr;
              p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val;
              local_98.super_Addr._vptr_Addr = local_68.super_Addr._vptr_Addr;
              local_98.val = local_68.val;
              local_68.super_Addr._vptr_Addr = pp_Var4;
              local_68.val = (int64_t)p_Var5;
            }
          }
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                    (&local_80,&local_68);
          iVar1 = *(int *)((long)(p_Var3 + 2) + 8);
          if (iVar1 - 7U < 2) {
            if (((local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) &&
                (pp_Var4 = local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr[1]._vptr_Addr, 0 < (long)pp_Var4)) &&
               (uVar8 = (long)pp_Var4 - ((ulong)pp_Var4 >> 1 & 0x5555555555555555),
               uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333),
               (byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2))
            {
              uVar8 = 0;
              while (((ulong)pp_Var4 >> (uVar8 & 0x3f) & 1) == 0) {
                uVar8 = uVar8 + 1;
                if ((int)uVar8 == 8) {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                                ,0x9c,
                                "int mocker::(anonymous namespace)::getNonzeroPos(std::uint64_t)");
                }
              }
              local_6c = (iVar1 != 7) + Shl;
              local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20)
              ;
              (local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count = 1;
              (local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count = 1;
              (local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base =
                   (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
              local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     (local_50.
                      super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 1);
              local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
              local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_use_count = (int)uVar8;
              local_50.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_weak_count = (int)(uVar8 >> 0x20);
              local_a8 = (ArithBinaryInst *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::IntLiteral>>
                        (&_Stack_a0,&local_a8,(allocator<mocker::ir::ArithBinaryInst> *)&local_a9,
                         (shared_ptr<mocker::ir::Reg> *)((long)(p_Var3 + 1) + 8),&local_6c,
                         (shared_ptr<mocker::ir::Addr> *)&local_98,&local_50);
              _Var9._M_pi = _Stack_a0._M_pi;
              pAVar7 = local_a8;
              local_a8 = (ArithBinaryInst *)0x0;
              _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
              p_Var10[1]._M_next = (_List_node_base *)pAVar7;
              p_Var10[1]._M_prev = (_List_node_base *)_Var9._M_pi;
              _Var9._M_pi = local_50.
                            super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                 _Var9._M_pi = local_50.
                               super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,
                 _Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
                _Var9._M_pi = local_50.
                              super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
              }
LAB_00159392:
              if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
              }
            }
          }
          else if (((iVar1 == 5) &&
                   (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0)) &&
                  (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   [1]._vptr_Addr == (_func_int **)0x0)) {
            local_a8 = (ArithBinaryInst *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Assign,std::allocator<mocker::ir::Assign>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>&>
                      (&_Stack_a0,(Assign **)&local_a8,(allocator<mocker::ir::Assign> *)&local_50,
                       (shared_ptr<mocker::ir::Reg> *)((long)(p_Var3 + 1) + 8),
                       (shared_ptr<mocker::ir::Addr> *)&local_98);
            _Var9._M_pi = _Stack_a0._M_pi;
            pAVar7 = local_a8;
            local_a8 = (ArithBinaryInst *)0x0;
            _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
            p_Var10[1]._M_next = (_List_node_base *)pAVar7;
            p_Var10[1]._M_prev = (_List_node_base *)_Var9._M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              _Var9._M_pi = _Stack_a0._M_pi;
              goto LAB_00159392;
            }
          }
          if (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.val);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.val);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      local_38 = local_38->_M_next;
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void CodegenPreparation::naiveStrengthReduction() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto binary = ir::dyc<ir::ArithBinaryInst>(inst);
      if (!binary)
        continue;
      auto lhs = binary->getLhs(), rhs = binary->getRhs();
      // Associativity is required here
      if (ir::dyc<ir::IntLiteral>(lhs) &&
          binary->getOp() != ir::ArithBinaryInst::Div)
        std::swap(lhs, rhs);
      auto lit = ir::dyc<ir::IntLiteral>(rhs);

      if (binary->getOp() == ir::ArithBinaryInst::Mul ||
          binary->getOp() == ir::ArithBinaryInst::Div) {
        if (!lit || lit->getVal() <= 0)
          continue;
        auto pos = getNonzeroPos(lit->getVal());
        if (pos == -1)
          continue;
        inst = std::make_shared<ir::ArithBinaryInst>(
            binary->getDest(),
            binary->getOp() == ir::ArithBinaryInst::Mul
                ? ir::ArithBinaryInst::Shl
                : ir::ArithBinaryInst::Shr,
            lhs, std::make_shared<ir::IntLiteral>(pos));
        continue;
      }

      if (binary->getOp() == ir::ArithBinaryInst::Add && lit &&
          lit->getVal() == 0) {
        inst = std::make_shared<ir::Assign>(binary->getDest(), lhs);
        continue;
      }
    }
  }
}